

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

bool __thiscall
despot::Parser::IsInTerminalStateSet(Parser *this,vector<int,_std::allocator<int>_> *state)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  const_iterator cVar4;
  int i;
  ulong uVar5;
  pointer pTVar6;
  vector<int,_std::allocator<int>_> val;
  
  uVar5 = 0;
  do {
    uVar2 = uVar5;
    pTVar6 = (this->terminal_state_patterns_).
             super__Vector_base<despot::TerminalPattern,_std::allocator<despot::TerminalPattern>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar3 = ((long)(this->terminal_state_patterns_).
                   super__Vector_base<despot::TerminalPattern,_std::allocator<despot::TerminalPattern>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar6) / 0x48;
    if (uVar3 <= uVar2) break;
    pTVar6 = pTVar6 + uVar2;
    val.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    val.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    val.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    for (uVar5 = 0;
        lVar1 = *(long *)&(pTVar6->state_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl,
        uVar5 < (ulong)((long)*(pointer *)
                               ((long)&(pTVar6->state_ids).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) -
                        lVar1 >> 2); uVar5 = uVar5 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 &val.super__Vector_base<int,_std::allocator<int>_>,
                 (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start + *(int *)(lVar1 + uVar5 * 4));
    }
    cVar4 = std::
            _Rb_tree<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::_Identity<std::vector<int,_std::allocator<int>_>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::find(&(pTVar6->state_vals)._M_t,
                   (key_type *)&val.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&val.super__Vector_base<int,_std::allocator<int>_>);
    uVar5 = uVar2 + 1;
  } while (cVar4._M_node == (_Base_ptr)((long)&(pTVar6->state_vals)._M_t._M_impl + 8U));
  return uVar2 < uVar3;
}

Assistant:

bool Parser::IsInTerminalStateSet(const vector<int>& state) const {
	for (int i = 0; i < terminal_state_patterns_.size(); i++) {
		const TerminalPattern& pattern = terminal_state_patterns_[i];
		vector<int> val;
		for (int i = 0; i < pattern.state_ids.size(); i++) {
			int id = pattern.state_ids[i];
			val.push_back(state[id]);
		}
		if (pattern.state_vals.find(val) != pattern.state_vals.end()) {
			return true;
		}
	}
	return false;
}